

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::generate<(Movetype)14,(Piece)2>(Movegen *this)

{
  U64 UVar1;
  Square *s;
  U64 c;
  U64 q;
  Square local_44;
  ulong local_40;
  ulong local_38;
  
  for (s = this->bishops; *s != no_square; s = s + 1) {
    UVar1 = magics::attacks<(Piece)2>(&this->all_pieces,s);
    local_38 = this->qtarget & UVar1;
    if (local_38 != 0) {
      local_40 = CONCAT44(local_40._4_4_,*s);
      encode<(Movetype)10>(this,&local_38,(int *)&local_40);
    }
    local_40 = UVar1 & this->ctarget;
    if (local_40 != 0) {
      local_44 = *s;
      encode<(Movetype)11>(this,&local_40,(int *)&local_44);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, bishop>() {
	for (Square* s = &bishops[0]; *s != no_square; ++s) {
		U64 mvs = magics::attacks<bishop>(all_pieces, *s);

		U64 q = mvs & qtarget;
		if (q != 0ULL) encode<quiet>(q, *s);

		U64 c = mvs & ctarget;
		if (c != 0ULL) encode<capture>(c, *s);
	}
}